

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteUInt32ToUtf16CharSequence
               (uint32_t number,vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  unsigned_short *__args;
  ushort local_1e;
  unsigned_short local_1c;
  unsigned_short local_1a;
  
  if (number < 0xd800) {
    __args = &local_1a;
  }
  else {
    for (; 0xd7ff < number; number = number >> 0xd) {
      local_1e = (ushort)number | 0xe000;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (output,&local_1e);
    }
    __args = &local_1c;
  }
  *__args = (unsigned_short)number;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
            (output,__args);
  return;
}

Assistant:

void WriteUInt32ToUtf16CharSequence(uint32_t number,
                                    std::vector<uint16_t>* output) {
  // For values in [0x0000, 0xD7FF], only use one char to encode it.
  if (number < 0xD800) {
    output->push_back(static_cast<uint16_t>(number));
    return;
  }
  // Encode into multiple chars. All except the last char will be in the range
  // [0xE000, 0xFFFF], and the last char will be in the range [0x0000, 0xD7FF].
  // Note that we don't use any value in range [0xD800, 0xDFFF] because they
  // have to come in pairs and the encoding is just more space-efficient w/o
  // them.
  while (number >= 0xD800) {
    // [0xE000, 0xFFFF] can represent 13 bits of info.
    output->push_back(static_cast<uint16_t>(0xE000 | (number & 0x1FFF)));
    number >>= 13;
  }
  output->push_back(static_cast<uint16_t>(number));
}